

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelInstance.cpp
# Opt level: O0

void __thiscall ModelInstance::assign(ModelInstance *this)

{
  ulong uVar1;
  float fVar2;
  float in_stack_000014e8;
  Topology in_stack_000014fc;
  vector<float,_std::allocator<float>_> *local_90;
  allocator<int> local_75;
  value_type_conflict1 local_74;
  vector<int,_std::allocator<int>_> local_70;
  vector<float,_std::allocator<float>_> local_58;
  array<std::vector<float,_std::allocator<float>_>,_2UL> local_40;
  ModelInstance *local_10;
  ModelInstance *this_local;
  
  local_10 = this;
  memcpy(&this->network,&stack0x00000008,0x14e4);
  this->position = (this->network).mismatchsite;
  this->state = 1;
  this->dt_react = in_stack_000014e8;
  this->dt_diff = 0.0001;
  this->totaltime = 300.0;
  updateStep(this);
  this->nick1 = -1.0;
  this->nick2 = -1.0;
  this->currenttime = 0.0;
  this->passed_mismatch = false;
  this->p_activate = 1.0;
  this->topology = in_stack_000014fc;
  local_90 = local_40._M_elems;
  do {
    memset(local_90,0,0x18);
    std::vector<float,_std::allocator<float>_>::vector(local_90);
    local_90 = local_90 + 1;
  } while (local_90 != (vector<float,_std::allocator<float>_> *)&local_10);
  std::array<std::vector<float,_std::allocator<float>_>,_2UL>::operator=
            (&this->dimersactive,&local_40);
  std::array<std::vector<float,_std::allocator<float>_>,_2UL>::~array(&local_40);
  local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<float,_std::allocator<float>_>::vector(&local_58);
  std::vector<float,_std::allocator<float>_>::operator=(&this->homotetramer,&local_58);
  std::vector<float,_std::allocator<float>_>::~vector(&local_58);
  fVar2 = this->totaltime / this->dt_react;
  uVar1 = (ulong)fVar2;
  local_74 = 0;
  std::allocator<int>::allocator(&local_75);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_70,uVar1 | (long)(fVar2 - 9.223372e+18) & (long)uVar1 >> 0x3f,&local_74,
             &local_75);
  std::vector<int,_std::allocator<int>_>::operator=(&this->states,&local_70);
  std::vector<int,_std::allocator<int>_>::~vector(&local_70);
  std::allocator<int>::~allocator(&local_75);
  return;
}

Assistant:

void ModelInstance::assign(NetworkArray net, ParameterObj par) {
	network = net;
	position = network.mismatchsite;	// starting position and mismatch position must be the same
	state = 1;						// graph is symmetric, so let all start in state 1
	dt_react = net.dt_react; 						// for reaction, check dt with networkarray for probabilities
	dt_diff = 100e-6;				// for diffusion
	totaltime = 300;
	updateStep();
	nick1 = -1;
	nick2 = -1;
	currenttime = 0;
	passed_mismatch = false;
	p_activate = 1;
	topology = par.top;

	dimersactive = std::array<std::vector<float>, 2> {};
	homotetramer = std::vector<float>{};
	states = std::vector<int>(totaltime/dt_react, 0);
}